

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,char *fileName,int numThreads)

{
  Data **ppDVar1;
  int iVar2;
  Data *pDVar3;
  StdIFStream *this_00;
  InputStreamMutex *pIVar4;
  stringstream _iex_replace_s;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__DeepScanLineInputFile_0043c978;
  pDVar3 = (Data *)operator_new(0x208);
  Data::Data(pDVar3,numThreads);
  ppDVar1 = &this->_data;
  *ppDVar1 = pDVar3;
  pDVar3->_deleteStream = true;
  this_00 = (StdIFStream *)operator_new(0x38);
  StdIFStream::StdIFStream(this_00,fileName);
  GenericInputFile::readMagicNumberAndVersionField
            (&this->super_GenericInputFile,(IStream *)this_00,&this->_data->version);
  pDVar3 = *ppDVar1;
  if ((pDVar3->version & 0x1000) == 0) {
    pIVar4 = (InputStreamMutex *)operator_new(0x38);
    (pIVar4->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    pIVar4->is = (IStream *)0x0;
    *(undefined8 *)((long)&(pIVar4->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (pIVar4->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (pIVar4->super_Mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(pIVar4->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
    pIVar4->currentPosition = 0;
    pDVar3->_streamData = pIVar4;
    pIVar4->is = (IStream *)this_00;
    iVar2 = (*(this_00->super_IStream)._vptr_IStream[2])(this_00);
    pDVar3 = *ppDVar1;
    pDVar3->memoryMapped = SUB41(iVar2,0);
    Header::readFrom(&pDVar3->header,pDVar3->_streamData->is,&pDVar3->version);
    Header::sanityCheck(&(*ppDVar1)->header,(bool)((byte)((uint)(*ppDVar1)->version >> 9) & 1),false
                       );
    initialize(this,&this->_data->header);
    pDVar3 = *ppDVar1;
    anon_unknown_7::readLineOffsets
              (pDVar3->_streamData->is,pDVar3->lineOrder,&pDVar3->lineOffsets,
               &pDVar3->fileIsComplete);
  }
  else {
    compatibilityInitialize(this,(IStream *)this_00);
  }
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile
    (const char fileName[], int numThreads)
:
     _data (new Data (numThreads))
{
    _data->_deleteStream = true;
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream* is = 0;

    try
    {
        is = new StdIFStream (fileName);
        readMagicNumberAndVersionField(*is, _data->version);
        //
        // Backward compatibility to read multpart file.
        // multiPartInitialize will create _streamData
        if (isMultiPart(_data->version))
        {
            compatibilityInitialize(*is);
            return;
        }
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (is)          delete is;
        if (_data)       delete _data;

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << fileName << "\". " << e.what());
        throw;
    }

    // 
    // not multiPart - allocate stream data and intialise as normal
    //
    try
    { 
        _data->_streamData = new InputStreamMutex();
        _data->_streamData->is = is;
        _data->memoryMapped = is->isMemoryMapped();
        _data->header.readFrom (*_data->_streamData->is, _data->version);
        _data->header.sanityCheck (isTiled (_data->version));

        initialize(_data->header);

        readLineOffsets (*_data->_streamData->is,
                         _data->lineOrder,
                         _data->lineOffsets,
                         _data->fileIsComplete);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (is)          delete is;
        if (_data && _data->_streamData)
        {
            delete _data->_streamData;
        }
        if (_data)       delete _data;

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << fileName << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        if (is)          delete is;
        if (_data && _data->_streamData)
        {
            delete _data->_streamData;
        }
        if (_data)       delete _data;

        throw;
    }
}